

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  ImGuiID id;
  ImVec2 *pos;
  ImVec2 local_6c;
  ImGuiID local_64;
  ImGuiID dockspace_id;
  char local_58 [8];
  char label [32];
  ImGuiWindowFlags local_2c;
  ImGuiWindowFlags host_window_flags;
  ImGuiWindowClass *local_20;
  ImGuiWindowClass *window_class_local;
  ImGuiViewport *pIStack_10;
  ImGuiDockNodeFlags dockspace_flags_local;
  ImGuiViewport *viewport_local;
  
  local_20 = window_class;
  window_class_local._4_4_ = dockspace_flags;
  pIStack_10 = viewport;
  if (viewport == (ImGuiViewport *)0x0) {
    pIStack_10 = GetMainViewport();
  }
  pos = &pIStack_10->WorkPos;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  SetNextWindowPos(pos,0,(ImVec2 *)&stack0xffffffffffffffd8);
  SetNextWindowSize(&pIStack_10->WorkSize,0);
  SetNextWindowViewport(pIStack_10->ID);
  local_2c = 0x282027;
  if ((window_class_local._4_4_ & 8) != 0) {
    local_2c = 0x2820a7;
  }
  ImFormatString(local_58,0x20,"DockSpaceViewport_%08X",(ulong)pIStack_10->ID);
  PushStyleVar(3,0.0);
  PushStyleVar(4,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,0.0,0.0);
  PushStyleVar(2,(ImVec2 *)&stack0xffffffffffffffa0);
  Begin(local_58,(_Bool *)0x0,local_2c);
  PopStyleVar(3);
  id = GetID("DockSpace");
  local_64 = id;
  ImVec2::ImVec2(&local_6c,0.0,0.0);
  DockSpace(id,&local_6c,window_class_local._4_4_,local_20);
  End();
  return local_64;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(const ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->WorkPos);
    SetNextWindowSize(viewport->WorkSize);
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}